

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process.hpp
# Opt level: O0

ssize_t __thiscall procxx::pipe_t::write(pipe_t *this,int __fd,void *__buf,size_t __n)

{
  reference pvVar1;
  ssize_t sVar2;
  int *piVar3;
  exception *this_00;
  undefined4 in_register_00000034;
  ssize_t bytes;
  uint64_t length_local;
  char *buf_local;
  pipe_t *this_local;
  
  pvVar1 = std::array<int,_2UL>::operator[](&this->pipe_,1);
  sVar2 = ::write(*pvVar1,(void *)CONCAT44(in_register_00000034,__fd),(size_t)__buf);
  if (sVar2 == -1) {
    piVar3 = __errno_location();
    if (*piVar3 != 4) {
      perror("pipe_t::write()");
      this_00 = (exception *)__cxa_allocate_exception(0x10);
      exception::runtime_error(this_00,"failed to write");
      __cxa_throw(this_00,&exception::typeinfo,exception::~exception);
    }
    sVar2 = write(this,__fd,__buf,__n);
  }
  else if (sVar2 < (long)__buf) {
    sVar2 = write(this,__fd + (int)sVar2,(void *)((long)__buf - sVar2),__n);
  }
  return sVar2;
}

Assistant:

void write(const char* buf, uint64_t length) {
    auto bytes = ::write(pipe_[WRITE_END], buf, length);
    if (bytes == -1) {
      // interrupt, just attempt to write again
      if (errno == EINTR)
        return write(buf, length);
      // otherwise, unrecoverable error
      perror("pipe_t::write()");
      throw exception{"failed to write"};
    }
    if (bytes < static_cast<ssize_t>(length))
      write(buf + bytes, length - static_cast<uint64_t>(bytes));
  }